

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_13x13(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp26;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp15;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_288 [16];
  int local_248 [8];
  int local_228 [8];
  int local_208 [8];
  int local_1e8 [8];
  int local_1c8 [8];
  int local_1a8 [8];
  int local_188 [8];
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [11];
  int local_dc;
  long local_d8;
  int *local_c8;
  short *local_c0;
  short *local_b8;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_d8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_c0 = *(short **)(in_RSI + 0x58);
  local_c8 = local_288;
  local_b8 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
    local_90 = (long)((int)*local_b8 * (int)*local_c0) * 0x2000 + 0x400;
    lVar1 = (long)((int)local_b8[0x10] * (int)local_c0[0x10]);
    lVar2 = (long)((int)local_b8[0x20] * (int)local_c0[0x20]) +
            (long)((int)local_b8[0x30] * (int)local_c0[0x30]);
    lVar3 = (long)((int)local_b8[0x20] * (int)local_c0[0x20]) -
            (long)((int)local_b8[0x30] * (int)local_c0[0x30]);
    local_70 = lVar3 * 0x319 + local_90;
    local_60 = lVar1 * 0x2bf1 + lVar2 * 0x24f9 + local_70;
    local_70 = lVar1 * 0x100c + lVar2 * -0x24f9 + local_70;
    local_88 = lVar3 * 0xf95 + local_90;
    local_68 = lVar1 * 0x21e0 + lVar2 * -0xa20 + local_88;
    local_88 = lVar1 * -0x2812 + lVar2 * 0xa20 + local_88;
    local_80 = lVar3 * 0x1dfe - local_90;
    local_78 = (lVar1 * -0x574 + lVar2 * -0xdf2) - local_80;
    local_80 = (lVar1 * -0x19b5 + lVar2 * 0xdf2) - local_80;
    local_90 = (lVar3 - lVar1) * 0x2d41 + local_90;
    lVar1 = (long)((int)local_b8[8] * (int)local_c0[8]);
    lVar2 = (long)((int)local_b8[0x18] * (int)local_c0[0x18]);
    lVar3 = (long)((int)local_b8[0x28] * (int)local_c0[0x28]);
    lVar4 = (long)((int)local_b8[0x38] * (int)local_c0[0x38]);
    lVar5 = (lVar1 + lVar2) * 0x2a50;
    lVar6 = (lVar1 + lVar3) * 0x253e;
    lVar7 = (lVar1 + lVar4) * 0x1e02;
    local_30 = lVar5 + lVar6 + lVar7 + lVar1 * -0x40a5;
    lVar8 = (lVar2 + lVar3) * -0xad5;
    lVar9 = (lVar2 + lVar4) * -0x253e;
    local_38 = lVar9 + lVar8 + lVar2 * 0x1acb + lVar5;
    local_48 = (lVar3 + lVar4) * -0x1508;
    local_40 = local_48 + lVar8 + lVar3 * -0x324f + lVar6;
    local_48 = local_48 + lVar9 + lVar4 * 0x4694 + lVar7;
    local_58 = (lVar1 + lVar4) * 0xad5;
    lVar5 = (lVar3 - lVar2) * 0x1e02;
    local_50 = lVar5 + local_58 + lVar1 * 0xa33 + lVar2 * -0xeea;
    local_58 = lVar5 + lVar3 * 0xc4e + lVar4 * -0x37c1 + local_58;
    *local_c8 = (int)(local_60 + local_30 >> 0xb);
    local_c8[0x60] = (int)(local_60 - local_30 >> 0xb);
    local_c8[8] = (int)(local_68 + local_38 >> 0xb);
    local_c8[0x58] = (int)(local_68 - local_38 >> 0xb);
    local_c8[0x10] = (int)(local_70 + local_40 >> 0xb);
    local_c8[0x50] = (int)(local_70 - local_40 >> 0xb);
    local_c8[0x18] = (int)(local_78 + local_48 >> 0xb);
    local_c8[0x48] = (int)(local_78 - local_48 >> 0xb);
    local_c8[0x20] = (int)(local_80 + local_50 >> 0xb);
    local_c8[0x40] = (int)(local_80 - local_50 >> 0xb);
    local_c8[0x28] = (int)(local_88 + local_58 >> 0xb);
    local_c8[0x38] = (int)(local_88 - local_58 >> 0xb);
    local_c8[0x30] = (int)(local_90 >> 0xb);
    local_b8 = local_b8 + 1;
    local_c0 = local_c0 + 1;
    local_c8 = local_c8 + 1;
  }
  local_c8 = local_288;
  for (local_dc = 0; local_dc < 0xd; local_dc = local_dc + 1) {
    puVar10 = (undefined1 *)(*(long *)(local_20 + (long)local_dc * 8) + (ulong)local_24);
    lVar1 = ((long)*local_c8 + 0x10) * 0x2000;
    lVar2 = (long)local_c8[2];
    lVar3 = (long)local_c8[4] + (long)local_c8[6];
    lVar4 = (long)local_c8[4] - (long)local_c8[6];
    lVar6 = lVar4 * 0x319 + lVar1;
    lVar5 = lVar2 * 0x2bf1 + lVar3 * 0x24f9 + lVar6;
    lVar6 = lVar2 * 0x100c + lVar3 * -0x24f9 + lVar6;
    lVar8 = lVar4 * 0xf95 + lVar1;
    lVar7 = lVar2 * 0x21e0 + lVar3 * -0xa20 + lVar8;
    lVar8 = lVar2 * -0x2812 + lVar3 * 0xa20 + lVar8;
    lVar11 = lVar4 * 0x1dfe + ((long)*local_c8 + 0x10) * -0x2000;
    lVar9 = (lVar2 * -0x574 + lVar3 * -0xdf2) - lVar11;
    lVar11 = (lVar2 * -0x19b5 + lVar3 * 0xdf2) - lVar11;
    lVar3 = (long)local_c8[1];
    lVar12 = (long)local_c8[3];
    lVar13 = (long)local_c8[5];
    lVar14 = (long)local_c8[7];
    lVar15 = (lVar3 + lVar12) * 0x2a50;
    lVar16 = (lVar3 + lVar13) * 0x253e;
    lVar17 = (lVar3 + lVar14) * 0x1e02;
    lVar18 = lVar15 + lVar16 + lVar17 + lVar3 * -0x40a5;
    lVar19 = (lVar12 + lVar13) * -0xad5;
    lVar20 = (lVar12 + lVar14) * -0x253e;
    lVar15 = lVar20 + lVar19 + lVar12 * 0x1acb + lVar15;
    lVar21 = (lVar13 + lVar14) * -0x1508;
    lVar16 = lVar21 + lVar19 + lVar13 * -0x324f + lVar16;
    lVar21 = lVar21 + lVar20 + lVar14 * 0x4694 + lVar17;
    lVar19 = (lVar3 + lVar14) * 0xad5;
    lVar17 = (lVar13 - lVar12) * 0x1e02;
    lVar3 = lVar17 + lVar19 + lVar3 * 0xa33 + lVar12 * -0xeea;
    lVar19 = lVar17 + lVar13 * 0xc4e + lVar14 * -0x37c1 + lVar19;
    *puVar10 = *(undefined1 *)(local_d8 + (int)((uint)(lVar5 + lVar18 >> 0x12) & 0x3ff));
    puVar10[0xc] = *(undefined1 *)(local_d8 + (int)((uint)(lVar5 - lVar18 >> 0x12) & 0x3ff));
    puVar10[1] = *(undefined1 *)(local_d8 + (int)((uint)(lVar7 + lVar15 >> 0x12) & 0x3ff));
    puVar10[0xb] = *(undefined1 *)(local_d8 + (int)((uint)(lVar7 - lVar15 >> 0x12) & 0x3ff));
    puVar10[2] = *(undefined1 *)(local_d8 + (int)((uint)(lVar6 + lVar16 >> 0x12) & 0x3ff));
    puVar10[10] = *(undefined1 *)(local_d8 + (int)((uint)(lVar6 - lVar16 >> 0x12) & 0x3ff));
    puVar10[3] = *(undefined1 *)(local_d8 + (int)((uint)(lVar9 + lVar21 >> 0x12) & 0x3ff));
    puVar10[9] = *(undefined1 *)(local_d8 + (int)((uint)(lVar9 - lVar21 >> 0x12) & 0x3ff));
    puVar10[4] = *(undefined1 *)(local_d8 + (int)((uint)(lVar11 + lVar3 >> 0x12) & 0x3ff));
    puVar10[8] = *(undefined1 *)(local_d8 + (int)((uint)(lVar11 - lVar3 >> 0x12) & 0x3ff));
    puVar10[5] = *(undefined1 *)(local_d8 + (int)((uint)(lVar8 + lVar19 >> 0x12) & 0x3ff));
    puVar10[7] = *(undefined1 *)(local_d8 + (int)((uint)(lVar8 - lVar19 >> 0x12) & 0x3ff));
    puVar10[6] = *(undefined1 *)
                  (local_d8 + (int)((uint)((lVar4 - lVar2) * 0x2d41 + lVar1 >> 0x12) & 0x3ff));
    local_c8 = local_c8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_13x13(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 13];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 13 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 13; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[4];
    z4 = (JLONG)wsptr[6];

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}